

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O3

void cuddHashTableQuit(DdHashTable *hash)

{
  uint uVar1;
  DdManager *table;
  DdHashItem *pDVar2;
  ulong uVar3;
  DdHashItem *pDVar4;
  
  uVar1 = hash->numBuckets;
  if ((ulong)uVar1 != 0) {
    table = hash->manager;
    uVar3 = 0;
    do {
      for (pDVar4 = hash->bucket[uVar3]; pDVar4 != (DdHashItem *)0x0; pDVar4 = pDVar4->next) {
        Cudd_RecursiveDeref(table,pDVar4->value);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar1);
  }
  pDVar4 = (DdHashItem *)hash->memoryList;
  while (pDVar4 != (DdHashItem *)0x0) {
    pDVar2 = pDVar4->next;
    free(pDVar4);
    pDVar4 = pDVar2;
  }
  if (hash->bucket != (DdHashItem **)0x0) {
    free(hash->bucket);
  }
  free(hash);
  return;
}

Assistant:

void
cuddHashTableQuit(
  DdHashTable * hash)
{
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    unsigned int i;
    DdManager *dd = hash->manager;
    DdHashItem *bucket;
    DdHashItem **memlist, **nextmem;
    unsigned int numBuckets = hash->numBuckets;

    for (i = 0; i < numBuckets; i++) {
        bucket = hash->bucket[i];
        while (bucket != NULL) {
            Cudd_RecursiveDeref(dd, bucket->value);
            bucket = bucket->next;
        }
    }

    memlist = hash->memoryList;
    while (memlist != NULL) {
        nextmem = (DdHashItem **) memlist[0];
        ABC_FREE(memlist);
        memlist = nextmem;
    }

    ABC_FREE(hash->bucket);
    ABC_FREE(hash);
#ifdef __osf__
#pragma pointer_size restore
#endif

    return;

}